

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O3

void __thiscall
pg::ZLKQSolver::attractVertices(ZLKQSolver *this,int pl,int v,bitset *Z,bitset *R,bitset *Y)

{
  uint uVar1;
  Game *pGVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  uint uVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  _label_vertex local_70;
  bitset *local_60;
  bitset *local_58;
  ostream *local_50;
  bitset *local_48;
  _label_vertex local_40;
  
  pGVar2 = (this->super_Solver).game;
  piVar14 = pGVar2->_inedges;
  iVar5 = pGVar2->_firstins[v];
  uVar8 = piVar14[iVar5];
  if (uVar8 != 0xffffffff) {
    piVar14 = piVar14 + iVar5;
    local_60 = R;
    local_58 = Y;
    local_48 = Z;
    do {
      uVar12 = (ulong)(int)uVar8;
      uVar15 = uVar12 >> 6;
      uVar13 = 1L << (uVar12 & 0x3f);
      puVar3 = local_48->_bits;
      if ((puVar3[uVar15] >> (uVar12 & 0x3f) & 1) == 0) {
        if ((R->_bits[uVar15] & uVar13) != 0) {
          pGVar2 = (this->super_Solver).game;
          puVar4 = (pGVar2->_owner)._bits;
          if ((uint)((puVar4[uVar15] & uVar13) != 0) != pl) {
            uVar1 = pGVar2->_outedges[pGVar2->_firstouts[uVar12]];
            if (uVar1 != 0xffffffff) {
              puVar9 = (uint *)(pGVar2->_outedges + (long)pGVar2->_firstouts[uVar12] + 1);
              do {
                uVar11 = (ulong)(long)(int)uVar1 >> 6;
                if (((puVar3[uVar11] >> ((ulong)uVar1 & 0x3f) & 1) == 0) &&
                   ((uVar10 = 1L << ((ulong)uVar1 & 0x3f), (R->_bits[uVar11] & uVar10) != 0 ||
                    ((local_58->_bits[uVar11] & uVar10) != 0)))) goto LAB_00156154;
                uVar1 = *puVar9;
                puVar9 = puVar9 + 1;
              } while (uVar1 != 0xffffffff);
            }
          }
          puVar3[uVar15] = puVar3[uVar15] | uVar13;
          iVar5 = -1;
          if ((uint)((puVar4[uVar15] & uVar13) != 0) == pl) {
            iVar5 = v;
          }
          this->str[uVar12] = iVar5;
          iVar5 = (this->Q).pointer;
          (this->Q).pointer = iVar5 + 1;
          (this->Q).queue[iVar5] = uVar8;
          if (2 < (this->super_Solver).trace) {
            local_50 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_50,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_70.g = (this->super_Solver).game;
            local_70.v = uVar8;
            poVar6 = operator<<(local_50,&local_70);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m by \x1b[1;36m",0xe);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m",3);
            poVar6 = (this->super_Solver).logger;
            if ((uint)(((((this->super_Solver).game)->_owner)._bits[uVar15] & uVar13) != 0) == pl) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," (via ",6);
              local_70.g = (this->super_Solver).game;
              local_70.v = v;
              poVar6 = operator<<(poVar6,&local_70);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              R = local_60;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," (forced)",9);
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              R = local_60;
            }
          }
        }
      }
      else if (((uint)(((((this->super_Solver).game)->_owner)._bits[uVar15] & uVar13) != 0) == pl)
              && (piVar7 = this->str, piVar7[uVar12] == -1)) {
        if (2 < (this->super_Solver).trace) {
          poVar6 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\x1b[1;37msetting strategy of \x1b[36m",0x20);
          local_70.g = (this->super_Solver).game;
          local_70.v = uVar8;
          poVar6 = operator<<(poVar6,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m to \x1b[1;36m",0xe);
          local_40.g = (this->super_Solver).game;
          local_40.v = v;
          poVar6 = operator<<(poVar6,&local_40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[m",3);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          R = local_60;
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          piVar7 = this->str;
        }
        piVar7[uVar12] = v;
      }
LAB_00156154:
      uVar8 = piVar14[1];
      piVar14 = piVar14 + 1;
    } while (uVar8 != 0xffffffff);
  }
  return;
}

Assistant:

void
ZLKQSolver::attractVertices(const int pl, const int v, bitset &Z, bitset &R, bitset &Y)
{
    auto curedge = ins(v);
    for (int from = *curedge; from != -1; from = *++curedge) {
        if (Z[from]) {
            // already in Z, set strategy if not yet set
            if (owner(from) == pl and str[from] == -1) {
#ifndef NDEBUG
                if (trace >= 3) {
                    logger << "\033[1;37msetting strategy of \033[36m" << label_vertex(from) << "\033[m to \033[1;36m" << label_vertex(v) << "\033[m" << std::endl;
                }
#endif
                str[from] = v;
            }
        } else if (R[from]) {
            // a vertex in <R> that is not yet in <Z>
            if (owner(from) != pl) {
                // check each exit
                bool escapes = false;
                auto curedge = outs(from);
                for (int to = *curedge; !escapes and to != -1; to = *++curedge) {
                    // check if escapes to a vertex in <R> or <Y> that is not in <Z>
                    if (!Z[to] and (R[to] or Y[to])) escapes = true;
                }
                if (escapes) continue;
            }
            // vertex does not escape, so attract it
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}